

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O2

void Abc_QuickSort3Dec_rec(word *pData,int l,int r)

{
  word wVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  word t;
  word wVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  lVar14 = (long)r;
  do {
    iVar2 = r - l;
    if (iVar2 == 0 || r < l) {
      return;
    }
    if (iVar2 < 10) {
      Abc_SelectSortDec(pData + l,iVar2 + 1);
      return;
    }
    wVar1 = pData[lVar14];
    lVar3 = (long)l;
    uVar6 = (ulong)(l - 1);
    uVar10 = (ulong)(uint)r;
    uVar7 = uVar6;
    iVar2 = r;
LAB_0039cc57:
    uVar6 = (long)(int)uVar6;
    do {
      uVar5 = uVar6;
      wVar11 = pData[uVar5 + 1];
      uVar6 = uVar5 + 1;
      uVar4 = (uint)wVar1;
    } while (uVar4 < (uint)wVar11);
    uVar9 = (long)(int)uVar10;
    do {
      lVar12 = uVar9 - 1;
      uVar10 = uVar9 - 1;
      if (l + 1 == (int)uVar9) break;
      uVar9 = uVar10;
    } while ((uint)pData[lVar12] < uVar4);
    lVar8 = (long)iVar2;
    lVar13 = (long)(int)uVar7;
    if ((long)uVar6 < (long)uVar10) {
      pData[uVar6] = pData[lVar12];
      pData[uVar10] = wVar11;
      if ((uint)pData[uVar6] == uVar4) {
        uVar7 = (ulong)((int)uVar7 + 1);
        wVar11 = pData[lVar13 + 1];
        pData[lVar13 + 1] = pData[uVar6];
        pData[uVar6] = wVar11;
        wVar11 = pData[uVar10];
      }
      if ((uint)wVar11 == uVar4) {
        iVar2 = iVar2 + -1;
        pData[uVar10] = pData[lVar8 + -1];
        pData[lVar8 + -1] = wVar11;
      }
      goto LAB_0039cc57;
    }
    pData[uVar6] = pData[lVar14];
    pData[lVar14] = wVar11;
    for (; uVar6 = uVar6 - 1, lVar3 < lVar13; lVar3 = lVar3 + 1) {
      wVar1 = pData[lVar3];
      pData[lVar3] = pData[uVar6];
      pData[uVar6] = wVar1;
    }
    lVar12 = (long)((int)uVar5 + 2);
    lVar3 = lVar14;
    while (lVar3 = lVar3 + -1, lVar8 < lVar3) {
      wVar1 = pData[lVar12];
      pData[lVar12] = pData[lVar3];
      pData[lVar3] = wVar1;
      lVar12 = lVar12 + 1;
    }
    Abc_QuickSort3Dec_rec(pData,l,(int)uVar6);
    l = (int)lVar12;
  } while( true );
}

Assistant:

void Abc_QuickSort3Dec_rec( word * pData, int l, int r )
{
    word v = pData[r];
    int k, i = l-1, j = r, p = l-1, q = r;
    if ( l >= r )
        return;
    assert( l < r );
    if ( r - l < 10 )
    {
        Abc_SelectSortDec( pData + l, r - l + 1 );
        return;
    }
    while ( 1 )
    {
        while ( (unsigned)pData[++i] > (unsigned)v );
        while ( (unsigned)v > (unsigned)pData[--j] )
            if ( j == l )
                break;
        if ( i >= j )
            break;
        ABC_SWAP( word, pData[i], pData[j] );
        if ( (unsigned)pData[i] == (unsigned)v ) 
            { p++; ABC_SWAP( word, pData[p], pData[i] ); }
        if ( (unsigned)v == (unsigned)pData[j] ) 
            { q--; ABC_SWAP( word, pData[j], pData[q] ); }
    }
    ABC_SWAP( word, pData[i], pData[r] ); 
    j = i-1; i = i+1;
    for ( k = l; k < p; k++, j-- ) 
        ABC_SWAP( word, pData[k], pData[j] );
    for ( k = r-1; k > q; k--, i++ ) 
        ABC_SWAP( word, pData[i], pData[k] );
    Abc_QuickSort3Dec_rec( pData, l, j );
    Abc_QuickSort3Dec_rec( pData, i, r );
}